

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redirect.cpp
# Opt level: O0

int main(int argc,char **args)

{
  char *pcVar1;
  int iVar2;
  SAXParser *this;
  long lVar3;
  long lVar4;
  ostream *poVar5;
  XMLSize_t XVar6;
  ulong uVar7;
  ErrorHandler *local_118;
  DocumentHandler *local_108;
  DTDHandler *local_f8;
  OutOfMemoryException *anon_var_0;
  XMLException *e;
  unsigned_long endMillis;
  unsigned_long startMillis;
  int errorCode;
  int errorCount;
  unsigned_long duration;
  RedirectHandlers handler;
  SAXParser *parser;
  char *xmlFile;
  XMLException *toCatch;
  char **args_local;
  int argc_local;
  
  uVar7 = 0;
  xercesc_4_0::XMLPlatformUtils::Initialize
            ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
             (MemoryManager *)0x0);
  if ((argc == 2) && (*args[1] != '-')) {
    pcVar1 = args[1];
    this = (SAXParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0x108,uVar7);
    xercesc_4_0::SAXParser::SAXParser
              (this,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
               (XMLGrammarPool *)0x0);
    handler.fSpaceCount = (XMLSize_t)this;
    RedirectHandlers::RedirectHandlers((RedirectHandlers *)&duration);
    local_f8 = (DTDHandler *)0x0;
    if (&stack0x00000000 != (undefined1 *)0x90) {
      local_f8 = &handler.super_HandlerBase.super_DTDHandler;
    }
    (**(code **)(*(long *)handler.fSpaceCount + 0x20))(handler.fSpaceCount,local_f8);
    local_108 = (DocumentHandler *)0x0;
    if (&stack0x00000000 != (undefined1 *)0x90) {
      local_108 = &handler.super_HandlerBase.super_DocumentHandler;
    }
    (**(code **)(*(long *)handler.fSpaceCount + 0x28))(handler.fSpaceCount,local_108);
    local_118 = (ErrorHandler *)0x0;
    if (&stack0x00000000 != (undefined1 *)0x90) {
      local_118 = &handler.super_HandlerBase.super_ErrorHandler;
    }
    (**(code **)(*(long *)handler.fSpaceCount + 0x50))(handler.fSpaceCount,local_118);
    lVar3 = xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
    (**(code **)(*(long *)handler.fSpaceCount + 0x40))(handler.fSpaceCount,pcVar1);
    lVar4 = xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
    iVar2 = xercesc_4_0::SAXParser::getErrorCount();
    if (iVar2 == 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,pcVar1);
      poVar5 = std::operator<<(poVar5,": ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,lVar4 - lVar3);
      poVar5 = std::operator<<(poVar5," ms (");
      XVar6 = RedirectHandlers::getElementCount((RedirectHandlers *)&duration);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,XVar6);
      poVar5 = std::operator<<(poVar5," elems, ");
      XVar6 = RedirectHandlers::getAttrCount((RedirectHandlers *)&duration);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,XVar6);
      poVar5 = std::operator<<(poVar5," attrs, ");
      XVar6 = RedirectHandlers::getSpaceCount((RedirectHandlers *)&duration);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,XVar6);
      poVar5 = std::operator<<(poVar5," spaces, ");
      XVar6 = RedirectHandlers::getCharacterCount((RedirectHandlers *)&duration);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,XVar6);
      poVar5 = std::operator<<(poVar5," chars)");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    if (handler.fSpaceCount != 0) {
      (**(code **)(*(long *)handler.fSpaceCount + 8))();
    }
    xercesc_4_0::XMLPlatformUtils::Terminate();
    if (iVar2 < 1) {
      args_local._4_4_ = 0;
    }
    else {
      args_local._4_4_ = 4;
    }
    RedirectHandlers::~RedirectHandlers((RedirectHandlers *)&duration);
  }
  else {
    usage();
    xercesc_4_0::XMLPlatformUtils::Terminate();
    args_local._4_4_ = 1;
  }
  return args_local._4_4_;
}

Assistant:

int main(int argc, char* args[])
{
    // Initialize the XML4C system
    try
    {
         XMLPlatformUtils::Initialize();
    }
    catch (const XMLException& toCatch)
    {
        std::cerr << "Error during initialization! Message:\n"
             << StrX(toCatch.getMessage()) << std::endl;
        return 1;
    }

    // We only have one parameter, which is the file to process
    // We only have one required parameter, which is the file to process
    if ((argc != 2) || (*(args[1]) == '-'))
    {
        usage();
        XMLPlatformUtils::Terminate();
        return 1;
    }

    const char*              xmlFile = args[1];

    //
    //  Create a SAX parser object. Then, according to what we were told on
    //  the command line, set it to validate or not.
    //
    SAXParser* parser = new SAXParser;

    //
    //  Create our SAX handler object and install it on the parser, as the
    //  document, entity and error handlers.
    //
    RedirectHandlers handler;
    parser->setDocumentHandler(&handler);
    parser->setErrorHandler(&handler);
    //Use the new XML Entity Resolver
    //parser->setEntityResolver(&handler);
    parser->setXMLEntityResolver(&handler);    

    //
    //  Get the starting time and kick off the parse of the indicated file.
    //  Catch any exceptions that might propogate out of it.
    //
    unsigned long duration;
    int errorCount = 0;
    int errorCode = 0;
    try
    {
        const unsigned long startMillis = XMLPlatformUtils::getCurrentMillis();
        parser->parse(xmlFile);
        const unsigned long endMillis = XMLPlatformUtils::getCurrentMillis();
        duration = endMillis - startMillis;
        errorCount = parser->getErrorCount();
    }
    catch (const OutOfMemoryException&)
    {
        std::cerr << "OutOfMemoryException" << std::endl;
        errorCode = 5;
    }
    catch (const XMLException& e)
    {
        std::cerr << "\nError during parsing: '" << xmlFile << "'\n"
                << "Exception message is:  \n"
                << StrX(e.getMessage()) << "\n" << std::endl;
        errorCode = 4;
    }

    if(errorCode) {
        XMLPlatformUtils::Terminate();
        return errorCode;
    }

    // Print out the stats that we collected and time taken.
    if (!errorCount) {
        std::cout << xmlFile << ": " << duration << " ms ("
             << handler.getElementCount() << " elems, "
             << handler.getAttrCount() << " attrs, "
             << handler.getSpaceCount() << " spaces, "
             << handler.getCharacterCount() << " chars)" << std::endl;
    }

    //
    //  Delete the parser itself.  Must be done prior to calling Terminate, below.
    //
    delete parser;

    XMLPlatformUtils::Terminate();

    if (errorCount > 0)
        return 4;
    else
        return 0;
}